

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::save_image(PathTracer *this,string *fname)

{
  size_t sVar1;
  size_t sVar2;
  uchar *in;
  uchar *__dest;
  pointer __src;
  size_t sVar3;
  bool bVar4;
  
  if (this->state != DONE) {
    return;
  }
  sVar1 = (this->frameBuffer).w;
  sVar2 = (this->frameBuffer).h;
  __src = (this->frameBuffer).data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start + (sVar2 - 1) * sVar1;
  in = (uchar *)operator_new__(-(ulong)(sVar2 * sVar1 >> 0x3e != 0) | sVar2 * sVar1 * 4);
  __dest = in;
  sVar3 = sVar2;
  while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
    memcpy(__dest,__src,sVar1 * 4);
    __src = __src + -sVar1;
    __dest = __dest + sVar1 * 4;
  }
  fprintf(_stderr,"[PathTracer] Saving to file: %s... ",(fname->_M_dataplus)._M_p);
  lodepng::encode(fname,in,(uint)sVar1,(uint)sVar2,LCT_RGBA,8);
  fwrite("Done!\n",6,1,_stderr);
  return;
}

Assistant:

void PathTracer::save_image(string fname) {

    if (state != DONE) return;

    uint32_t* frame = &frameBuffer.data[0];
    size_t w = frameBuffer.w;
    size_t h = frameBuffer.h;
    uint32_t* frame_out = new uint32_t[w * h];
    for(size_t i = 0; i < h; ++i) {
      memcpy(frame_out + i * w, frame + (h - i - 1) * w, 4 * w);
    }

    fprintf(stderr, "[PathTracer] Saving to file: %s... ", fname.c_str());
    lodepng::encode(fname, (unsigned char*) frame_out, w, h);
    fprintf(stderr, "Done!\n");
  }